

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O3

SENode * __thiscall
spvtools::opt::ScalarEvolutionAnalysis::CreateSubtraction
          (ScalarEvolutionAnalysis *this,SENode *operand_1,SENode *operand_2)

{
  long lVar1;
  int iVar2;
  SENode *pSVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  iVar2 = (**operand_1->_vptr_SENode)(operand_1);
  if (iVar2 == 0) {
    iVar2 = (**operand_2->_vptr_SENode)(operand_2);
    if (iVar2 == 0) {
      iVar2 = (*operand_1->_vptr_SENode[4])(operand_1);
      lVar1 = *(long *)(CONCAT44(extraout_var,iVar2) + 0x30);
      iVar2 = (*operand_2->_vptr_SENode[4])(operand_2);
      pSVar3 = CreateConstant(this,lVar1 - *(long *)(CONCAT44(extraout_var_00,iVar2) + 0x30));
      return pSVar3;
    }
  }
  pSVar3 = CreateNegation(this,operand_2);
  pSVar3 = CreateAddNode(this,operand_1,pSVar3);
  return pSVar3;
}

Assistant:

SENode* ScalarEvolutionAnalysis::CreateSubtraction(SENode* operand_1,
                                                   SENode* operand_2) {
  // Fold if both operands are constant.
  if (operand_1->GetType() == SENode::Constant &&
      operand_2->GetType() == SENode::Constant) {
    return CreateConstant(operand_1->AsSEConstantNode()->FoldToSingleValue() -
                          operand_2->AsSEConstantNode()->FoldToSingleValue());
  }

  return CreateAddNode(operand_1, CreateNegation(operand_2));
}